

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.cc
# Opt level: O1

void hexdump(FILE *fp,char *msg,void *in,size_t len)

{
  size_t sVar1;
  
  fputs(msg,(FILE *)fp);
  if (len != 0) {
    sVar1 = 0;
    do {
      fprintf((FILE *)fp,"%02x",(ulong)*(byte *)((long)in + sVar1));
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
  }
  fputs("\n",(FILE *)fp);
  return;
}

Assistant:

void hexdump(FILE *fp, const char *msg, const void *in, size_t len) {
  const uint8_t *data = reinterpret_cast<const uint8_t*>(in);

  fputs(msg, fp);
  for (size_t i = 0; i < len; i++) {
    fprintf(fp, "%02x", data[i]);
  }
  fputs("\n", fp);
}